

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CanAnalyzerResults.cpp
# Opt level: O3

void __thiscall
CanAnalyzerResults::DisplayStringFromData
          (CanAnalyzerResults *this,U64 frame,DisplayBase display_base,char *output,
          U32 result_string_max_length)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  char tmp [128];
  stringstream ss;
  undefined1 *local_258 [2];
  undefined1 local_248 [112];
  char *local_1d8;
  char local_1c8 [16];
  stringstream local_1b8 [16];
  long local_1a8;
  string local_1a0 [104];
  ios_base local_138 [264];
  
  uVar5 = frame >> 0x10 & 0xff;
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar4 = 9;
  if (uVar5 < 9) {
    uVar4 = uVar5;
  }
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
  std::__cxx11::stringbuf::str(local_1a0);
  if (local_258[0] != local_248) {
    operator_delete(local_258[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Dev: ",5);
  pcVar1 = DeviceTypeLookup[(uint)(frame >> 0x18) & 0x1f];
  iVar2 = (int)(ostream *)&local_1a8;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(local_1a8 + -0x18) + iVar2);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," M: ",4);
  pcVar1 = ManufacturerLookup[uVar4];
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(local_1a8 + -0x18) + iVar2);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar1,sVar3);
  }
  AnalyzerHelpers::GetNumberString
            ((ulong)((uint)(frame >> 10) & 0x3f),display_base,6,(char *)local_258,0x80);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," Class: ",8);
  sVar3 = strlen((char *)local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,(char *)local_258,sVar3);
  AnalyzerHelpers::GetNumberString
            ((ulong)((uint)(frame >> 6) & 0xf),display_base,4,(char *)local_258,0x80);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," Idx: ",6);
  sVar3 = strlen((char *)local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,(char *)local_258,sVar3);
  AnalyzerHelpers::GetNumberString
            ((ulong)((uint)frame & 0x3f),display_base,6,(char *)local_258,0x80);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ID: ",5);
  sVar3 = strlen((char *)local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,(char *)local_258,sVar3);
  std::__cxx11::stringbuf::str();
  strncpy(output,local_1d8,(ulong)(result_string_max_length - 1));
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  output[result_string_max_length - 1] = '\0';
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void CanAnalyzerResults::DisplayStringFromData(U64 frame, DisplayBase display_base, char* output, U32 result_string_max_length)
{
    U64 DeviceType = (frame & DEVICE_TYPE_MASK) >> DEVICE_TYPE_SHIFT;
    U64 Manufacturer = (frame & MANUFACTURER_MASK) >> MANUFACTURER_SHIFT;
    U64 APIClass = (frame & API_CLASS_MASK) >> API_CLASS_SHIFT;
    U64 APIIndex = (frame & API_INDEX_MASK) >> API_INDEX_SHIFT;
    U64 CANID = (frame & CANID_MASK) >> CANID_SHIFT;

    std::stringstream ss;

    if (DeviceType > NUM_DEVICE_TYPE)
        DeviceType = NUM_DEVICE_TYPE;
    if (Manufacturer > NUM_MANUFACTURER)
        Manufacturer = NUM_MANUFACTURER;

    ss.str("");
    ss << "Dev: " << DeviceTypeLookup[DeviceType] << " M: " << ManufacturerLookup[Manufacturer];

    U32 numChars = 128;

    char tmp[128];
    AnalyzerHelpers::GetNumberString(APIClass, display_base, API_CLASS_BITS, tmp, numChars);
    ss << " Class: " << tmp;
    AnalyzerHelpers::GetNumberString(APIIndex, display_base, API_INDEX_BITS, tmp, numChars);
    ss << " Idx: " << tmp;
    AnalyzerHelpers::GetNumberString(CANID, display_base, CANID_BITS, tmp, numChars);
    ss << " ID: " << tmp;

    strncpy(output, ss.str().c_str(), result_string_max_length-1);
    output[result_string_max_length - 1] = '\0';
}